

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftrfork.c
# Opt level: O0

FT_Error raccess_guess_darwin_newvfs
                   (FT_Library library,FT_Stream stream,char *base_file_name,char **result_file_name
                   ,FT_Long *result_offset)

{
  size_t __n;
  FT_Pointer __dest;
  FT_Long base_file_len;
  FT_Memory memory;
  char *newpath;
  FT_Long *pFStack_38;
  FT_Error error;
  FT_Long *result_offset_local;
  char **result_file_name_local;
  char *base_file_name_local;
  FT_Stream stream_local;
  FT_Library library_local;
  
  pFStack_38 = result_offset;
  result_offset_local = (FT_Long *)result_file_name;
  result_file_name_local = (char **)base_file_name;
  base_file_name_local = (char *)stream;
  stream_local = (FT_Stream)library;
  __n = strlen(base_file_name);
  if ((long)(__n + 0x12) < 0x80000000) {
    __dest = ft_mem_alloc((FT_Memory)stream_local->base,__n + 0x12,(FT_Error *)((long)&newpath + 4))
    ;
    if (newpath._4_4_ == 0) {
      memcpy(__dest,result_file_name_local,__n);
      builtin_strncpy((char *)((long)__dest + __n),"/..named",8);
      builtin_strncpy((char *)((long)__dest + __n + 8),"fork/rsr",8);
      *(undefined2 *)((long)__dest + __n + 0x10) = 99;
      *result_offset_local = (FT_Long)__dest;
      *pFStack_38 = 0;
      library_local._4_4_ = 0;
    }
    else {
      library_local._4_4_ = newpath._4_4_;
    }
  }
  else {
    library_local._4_4_ = 10;
  }
  return library_local._4_4_;
}

Assistant:

static FT_Error
  raccess_guess_darwin_newvfs( FT_Library  library,
                               FT_Stream   stream,
                               char       *base_file_name,
                               char      **result_file_name,
                               FT_Long    *result_offset )
  {
    /*
      Only meaningful on systems with Mac OS X (> 10.1).
     */
    FT_Error   error;
    char*      newpath = NULL;
    FT_Memory  memory;
    FT_Long    base_file_len = (FT_Long)ft_strlen( base_file_name );

    FT_UNUSED( stream );


    memory = library->memory;

    if ( base_file_len + 18 > FT_INT_MAX )
      return FT_THROW( Array_Too_Large );

    if ( FT_ALLOC( newpath, base_file_len + 18 ) )
      return error;

    FT_MEM_COPY( newpath, base_file_name, base_file_len );
    FT_MEM_COPY( newpath + base_file_len, "/..namedfork/rsrc", 18 );

    *result_file_name = newpath;
    *result_offset    = 0;

    return FT_Err_Ok;
  }